

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

void __thiscall
cs_impl::
cni_holder<void_(cs_impl::member_visitor::*)(const_cs_impl::any_&)_const,_void_(*)(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)>
::cni_holder(cni_holder<void_(cs_impl::member_visitor::*)(const_cs_impl::any_&)_const,_void_(*)(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)>
             *this,offset_in_member_visitor_to_subr *func)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  (this->super_cni_holder_base)._vptr_cni_holder_base = (_func_int **)&PTR__cni_holder_00377ce8;
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  if ((void *)*func != (void *)0x0) {
    local_28._8_8_ = func[1];
    pcStack_10 = std::
                 _Function_handler<void_(const_cs_impl::member_visitor_&,_const_cs_impl::any_&),_void_(cs_impl::member_visitor::*)(const_cs_impl::any_&)_const>
                 ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(const_cs_impl::member_visitor_&,_const_cs_impl::any_&),_void_(cs_impl::member_visitor::*)(const_cs_impl::any_&)_const>
               ::_M_manager;
    local_28._M_unused._M_object = (void *)*func;
  }
  std::function<void_(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)>::function
            (&(this->mCni).mFunc,
             (function<void_(const_cs_impl::member_visitor_&,_const_cs_impl::any_&)> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}